

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cGPUShader5Tests.cpp
# Opt level: O2

void __thiscall
gl3cts::GPUShader5ImplicitConversionsTest::executeTestCase
          (GPUShader5ImplicitConversionsTest *this,testCase *test_case)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  GPUShader5ImplicitConversionsTest *this_00;
  programInfo program;
  string local_58;
  string local_38;
  long lVar3;
  
  this_00 = (GPUShader5ImplicitConversionsTest *)test_case;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  getFragmentShader_abi_cxx11_(&local_38,this_00);
  getVertexShader_abi_cxx11_
            (&local_58,this_00,test_case->m_destination_type,test_case->m_source_type);
  program.m_context = (this->super_TestCase).m_context;
  program.m_fragment_shader_id = 0;
  program.m_program_object_id = 0;
  program.m_vertex_shader_id = 0;
  Utils::programInfo::build(&program,local_38._M_dataplus._M_p,local_58._M_dataplus._M_p);
  (**(code **)(lVar3 + 0x1680))(program.m_program_object_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                  ,0x228);
  Utils::programInfo::setUniform
            (&program,test_case->m_source_variable_type,"u1",test_case->m_u1_data);
  Utils::programInfo::setUniform
            (&program,test_case->m_source_variable_type,"u2",test_case->m_u2_data);
  (**(code **)(lVar3 + 0x1c0))(0x3f000000,0x3f000000,0x3f000000,0x3f000000);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"clearColor",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                  ,0x22f);
  (**(code **)(lVar3 + 0x188))(0x4000);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                  ,0x232);
  (**(code **)(lVar3 + 0x538))(5,0,4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                  ,0x236);
  Utils::programInfo::~programInfo(&program);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  verifyImage(this,0xffffffff,test_case->m_is_white_expected);
  return;
}

Assistant:

void GPUShader5ImplicitConversionsTest::executeTestCase(const testCase& test_case)
{
	static const glw::GLuint white_color = 0xffffffff;

	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Run test case */
	{
		/* Get shaders */
		const std::string& fs = getFragmentShader();
		const std::string& vs = getVertexShader(test_case.m_destination_type, test_case.m_source_type);

		/* Prepare program */
		Utils::programInfo program(m_context);

		program.build(fs.c_str(), vs.c_str());

		gl.useProgram(program.m_program_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

		program.setUniform(test_case.m_source_variable_type, "u1", test_case.m_u1_data);
		program.setUniform(test_case.m_source_variable_type, "u2", test_case.m_u2_data);

		/* Clear FBO */
		gl.clearColor(0.5f, 0.5f, 0.5f, 0.5f);
		GLU_EXPECT_NO_ERROR(gl.getError(), "clearColor");

		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

		/* Draw a triangle strip */
		gl.drawArrays(GL_TRIANGLE_STRIP, 0 /* first */, 4 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "drawArrays");
	}

	/* Verification */
	verifyImage(white_color, test_case.m_is_white_expected);
}